

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Cpu.h
# Opt level: O1

void __thiscall Hes_Emu::irq_changed(Hes_Emu *this)

{
  byte bVar1;
  state_t *psVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  psVar2 = (this->super_Hes_Cpu).state;
  iVar3 = psVar2->time + psVar2->base;
  if (((iVar3 < (this->irq).timer) &&
      ((this->irq).timer = 0x40000000, (this->timer).enabled != '\0')) &&
     ((this->timer).fired == '\0')) {
    (this->irq).timer = (this->timer).count + iVar3;
  }
  if ((iVar3 < (this->irq).vdp) && ((this->irq).vdp = 0x40000000, ((this->vdp).control & 8) != 0)) {
    (this->irq).vdp = (this->vdp).next_vbl;
  }
  bVar1 = (this->irq).disables;
  iVar4 = 0x40000000;
  if ((bVar1 & 4) == 0) {
    iVar4 = (this->irq).timer;
  }
  iVar6 = (this->irq).vdp;
  if (iVar4 < iVar6) {
    iVar6 = iVar4;
  }
  if ((bVar1 & 2) != 0) {
    iVar6 = iVar4;
  }
  iVar4 = (this->super_Hes_Cpu).end_time_;
  (this->super_Hes_Cpu).irq_time_ = iVar6;
  iVar5 = iVar4;
  if (((this->super_Hes_Cpu).r.status & 4) == 0) {
    iVar5 = iVar6;
  }
  if (iVar4 <= iVar6) {
    iVar5 = iVar4;
  }
  psVar2->base = iVar5;
  psVar2->time = iVar3 - iVar5;
  return;
}

Assistant:

hes_time_t time() const             { return state->time + state->base; }